

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fftlib.c
# Opt level: O2

void riffts1(float *ioptr,long M,long Rows,float *Utbl,short *BRLow)

{
  ulong M_00;
  float *pfVar1;
  float fVar2;
  undefined8 uVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  long StageCnt;
  long lVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  double dVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long NDiffU;
  long lVar20;
  float *ioptr_00;
  ulong uVar21;
  ulong uVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  ulong uVar26;
  long lVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [32];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [16];
  undefined1 auVar54 [32];
  long lStack_d0;
  
  auVar54 = _DAT_00105240;
  dVar16 = (double)(0x3ff0000000000000 - (M << 0x34));
  auVar29._0_4_ = (float)dVar16;
  auVar29._4_4_ = (int)((ulong)dVar16 >> 0x20);
  auVar29._8_8_ = 0;
  switch(M) {
  case 0:
    break;
  case 1:
    lVar24 = 1L << (M & 0x3fU);
    for (lVar17 = Rows; 0 < lVar17; lVar17 = lVar17 + -1) {
      fVar2 = *ioptr;
      *ioptr = (ioptr[1] + fVar2) * auVar29._0_4_;
      ioptr[1] = (fVar2 - ioptr[1]) * auVar29._0_4_;
      ioptr = ioptr + lVar24;
    }
    Rows = Rows & Rows >> 0x3f;
    auVar44 = _DAT_001051e0;
    auVar28 = _DAT_001051d0;
    goto LAB_00104701;
  case 2:
    lVar24 = 4;
    auVar44 = _DAT_001051e0;
    auVar28 = _DAT_001051d0;
LAB_00104701:
    while (0 < Rows) {
      Rows = Rows - 1;
      fVar2 = (float)*(undefined8 *)(ioptr + 2);
      fVar4 = (float)((ulong)*(undefined8 *)(ioptr + 2) >> 0x20);
      auVar31._0_4_ = fVar2 + fVar2;
      auVar31._4_4_ = fVar4 + fVar4;
      auVar31._8_8_ = 0;
      auVar32 = vpermt2ps_avx512vl(auVar31,auVar28,ZEXT416((uint)(ioptr[1] + *ioptr)));
      auVar30 = vinsertps_avx(auVar32,ZEXT416((uint)(*ioptr - ioptr[1])),0x30);
      auVar31 = vshufpd_avx(auVar30,auVar30,1);
      auVar33._0_4_ = auVar32._0_4_ + auVar31._0_4_;
      auVar33._4_4_ = auVar32._4_4_ + auVar31._4_4_;
      auVar33._8_4_ = auVar32._8_4_ + auVar31._8_4_;
      auVar33._12_4_ = auVar32._12_4_ + auVar31._12_4_;
      auVar30 = vsubps_avx(auVar30,auVar31);
      auVar30 = vpermt2ps_avx512vl(auVar33,auVar44,auVar30);
      *ioptr = auVar30._0_4_ * auVar29._0_4_;
      ioptr[1] = auVar30._4_4_ * auVar29._0_4_;
      ioptr[2] = auVar30._8_4_ * auVar29._0_4_;
      ioptr[3] = auVar30._12_4_ * auVar29._0_4_;
      ioptr = ioptr + lVar24;
    }
    break;
  case 3:
    while (0 < Rows) {
      Rows = Rows + -1;
      fVar2 = ioptr[1] + *ioptr;
      fVar9 = *ioptr - ioptr[1];
      fVar4 = ioptr[6] + ioptr[2];
      fVar10 = ioptr[3] - ioptr[7];
      fVar5 = ioptr[5] + ioptr[5];
      fVar8 = ioptr[4] + ioptr[4];
      fVar6 = (ioptr[2] - ioptr[6]) * 0.70710677;
      fVar7 = (ioptr[7] + ioptr[3]) * -0.70710677;
      fVar11 = (fVar4 - fVar6) + fVar7;
      fVar7 = fVar10 + fVar6 + fVar7;
      auVar44 = vinsertps_avx(ZEXT416((uint)(fVar8 + fVar2)),ZEXT416((uint)(fVar9 - fVar5)),0x10);
      fVar11 = (fVar11 - (fVar4 + fVar4)) + fVar11;
      auVar28 = vinsertps_avx(ZEXT416((uint)(fVar4 + fVar4)),
                              ZEXT416((uint)((fVar7 - (fVar10 + fVar10)) + fVar7)),0x10);
      auVar44 = vinsertps_avx(auVar44,ZEXT416((uint)(fVar10 + fVar10)),0x20);
      auVar28 = vinsertps_avx(auVar28,ZEXT416((uint)(fVar2 - fVar8)),0x20);
      auVar44 = vinsertps_avx(auVar44,ZEXT416((uint)(fVar5 + fVar9)),0x30);
      auVar50._16_16_ = auVar28;
      auVar50._0_16_ = auVar44;
      auVar51._4_4_ = fVar11;
      auVar51._0_4_ = fVar11;
      auVar51._8_4_ = fVar11;
      auVar51._12_4_ = fVar11;
      auVar51._16_4_ = fVar11;
      auVar51._20_4_ = fVar11;
      auVar51._24_4_ = fVar11;
      auVar51._28_4_ = fVar11;
      auVar51 = vblendps_avx(auVar50,auVar51,0x80);
      auVar45 = vpermpd_avx2(auVar51,0x4e);
      auVar52._0_4_ = auVar51._0_4_ + auVar45._0_4_;
      auVar52._4_4_ = auVar51._4_4_ + auVar45._4_4_;
      auVar52._8_4_ = auVar51._8_4_ + auVar45._8_4_;
      auVar52._12_4_ = auVar51._12_4_ + auVar45._12_4_;
      auVar52._16_4_ = auVar51._16_4_ + auVar45._16_4_;
      auVar52._20_4_ = auVar51._20_4_ + auVar45._20_4_;
      auVar52._24_4_ = auVar51._24_4_ + auVar45._24_4_;
      auVar52._28_4_ = auVar51._28_4_ + auVar45._28_4_;
      auVar51 = vsubps_avx(auVar50,auVar45);
      auVar45 = vpermt2ps_avx512vl(auVar52,auVar54,auVar51);
      *ioptr = auVar45._0_4_ * auVar29._0_4_;
      ioptr[1] = auVar45._4_4_ * auVar29._0_4_;
      ioptr[2] = auVar45._8_4_ * auVar29._0_4_;
      ioptr[3] = auVar45._12_4_ * auVar29._0_4_;
      ioptr[4] = auVar45._16_4_ * auVar29._0_4_;
      ioptr[5] = auVar45._20_4_ * auVar29._0_4_;
      ioptr[6] = auVar45._24_4_ * auVar29._0_4_;
      ioptr[7] = auVar51._28_4_;
      ioptr = ioptr + (1L << (M & 0x3fU));
    }
    break;
  case 4:
    auVar46 = vbroadcastss_avx512f(auVar29);
    while (0 < Rows) {
      Rows = Rows + -1;
      auVar28 = vaddss_avx512f(ZEXT416((uint)*(float *)((long)*(undefined1 (*) [64])ioptr + 4)),
                               ZEXT416((uint)*(float *)*(undefined1 (*) [64])ioptr));
      auVar29 = vaddss_avx512f(ZEXT416((uint)*(float *)((long)*(undefined1 (*) [64])ioptr + 0x30)),
                               ZEXT416((uint)*(float *)((long)*(undefined1 (*) [64])ioptr + 0x10)));
      auVar44 = vsubss_avx512f(ZEXT416((uint)*(float *)((long)*(undefined1 (*) [64])ioptr + 0x10)),
                               ZEXT416((uint)*(float *)((long)*(undefined1 (*) [64])ioptr + 0x30)));
      auVar30 = vsubss_avx512f(ZEXT416((uint)*(float *)((long)*(undefined1 (*) [64])ioptr + 0x14)),
                               ZEXT416((uint)*(float *)((long)*(undefined1 (*) [64])ioptr + 0x34)));
      auVar31 = vaddss_avx512f(ZEXT416((uint)*(float *)((long)*(undefined1 (*) [64])ioptr + 0x34)),
                               ZEXT416((uint)*(float *)((long)*(undefined1 (*) [64])ioptr + 0x14)));
      auVar32 = vsubss_avx512f(ZEXT416((uint)*(float *)((long)*(undefined1 (*) [64])ioptr + 0xc)),
                               ZEXT416((uint)*(float *)((long)*(undefined1 (*) [64])ioptr + 0x3c)));
      auVar33 = vaddss_avx512f(ZEXT416((uint)*(float *)((long)*(undefined1 (*) [64])ioptr + 0x3c)),
                               ZEXT416((uint)*(float *)((long)*(undefined1 (*) [64])ioptr + 0xc)));
      auVar34 = vsubss_avx512f(ZEXT416((uint)*(float *)((long)*(undefined1 (*) [64])ioptr + 0x1c)),
                               ZEXT416((uint)*(float *)((long)*(undefined1 (*) [64])ioptr + 0x2c)));
      auVar35 = vaddss_avx512f(ZEXT416((uint)*(float *)((long)*(undefined1 (*) [64])ioptr + 0x2c)),
                               ZEXT416((uint)*(float *)((long)*(undefined1 (*) [64])ioptr + 0x1c)));
      auVar36 = vaddss_avx512f(ZEXT416((uint)*(float *)((long)*(undefined1 (*) [64])ioptr + 0x24)),
                               ZEXT416((uint)*(float *)((long)*(undefined1 (*) [64])ioptr + 0x24)));
      auVar37 = vaddss_avx512f(ZEXT416((uint)*(float *)((long)*(undefined1 (*) [64])ioptr + 0x20)),
                               ZEXT416((uint)*(float *)((long)*(undefined1 (*) [64])ioptr + 0x20)));
      fVar4 = auVar31._0_4_ * -0.70710677;
      auVar38 = ZEXT416((uint)(*(float *)*(undefined1 (*) [64])ioptr -
                              *(float *)((long)*(undefined1 (*) [64])ioptr + 4)));
      auVar31 = vsubss_avx512f(auVar38,auVar36);
      auVar36 = vaddss_avx512f(auVar36,auVar38);
      auVar38 = ZEXT416((uint)(auVar44._0_4_ * 0.70710677));
      auVar44 = vsubss_avx512f(auVar29,auVar38);
      auVar38 = vaddss_avx512f(auVar30,auVar38);
      fVar2 = auVar29._0_4_ + auVar29._0_4_;
      auVar29 = vaddss_avx512f(auVar44,ZEXT416((uint)fVar4));
      auVar30 = vaddss_avx512f(auVar30,auVar30);
      auVar44 = vaddss_avx512f(ZEXT416((uint)*(float *)((long)*(undefined1 (*) [64])ioptr + 0x38)),
                               ZEXT416((uint)*(float *)((long)*(undefined1 (*) [64])ioptr + 8)));
      auVar39 = vsubss_avx512f(ZEXT416((uint)*(float *)((long)*(undefined1 (*) [64])ioptr + 8)),
                               ZEXT416((uint)*(float *)((long)*(undefined1 (*) [64])ioptr + 0x38)));
      auVar48 = SUB6416(ZEXT464(0xbec3ef15),0);
      auVar40 = vfmadd213ss_avx512f(auVar48,auVar39,auVar44);
      auVar39 = vfmadd132ss_avx512f(auVar39,auVar32,SUB6416(ZEXT464(0x3f6c835e),0));
      auVar42 = ZEXT416((uint)(auVar38._0_4_ + fVar4));
      auVar38 = vsubss_avx512f(auVar42,auVar30);
      auVar41 = vsubss_avx512f(auVar29,ZEXT416((uint)fVar2));
      auVar38 = vaddss_avx512f(auVar38,auVar42);
      auVar41 = vaddss_avx512f(auVar41,auVar29);
      auVar49 = SUB6416(ZEXT464(0xbf6c835e),0);
      auVar40 = vfmadd231ss_avx512f(auVar40,auVar33,auVar49);
      auVar29 = vfmadd231ss_fma(auVar39,auVar48,auVar33);
      auVar33 = vaddss_avx512f(ZEXT416((uint)*(float *)((long)*(undefined1 (*) [64])ioptr + 0x28)),
                               ZEXT416((uint)*(float *)((long)*(undefined1 (*) [64])ioptr + 0x18)));
      auVar39 = vsubss_avx512f(ZEXT416((uint)*(float *)((long)*(undefined1 (*) [64])ioptr + 0x18)),
                               ZEXT416((uint)*(float *)((long)*(undefined1 (*) [64])ioptr + 0x28)));
      auVar42 = vaddss_avx512f(auVar38,auVar31);
      auVar31 = vsubss_avx512f(auVar31,auVar38);
      auVar38 = vsubss_avx512f(auVar36,auVar41);
      auVar36 = vaddss_avx512f(auVar41,auVar36);
      auVar41 = vfmadd213ss_avx512f(auVar49,auVar39,auVar33);
      auVar39 = vfmadd132ss_avx512f(auVar39,auVar34,SUB6416(ZEXT464(0x3ec3ef15),0));
      auVar53 = SUB6416(ZEXT464(0x40000000),0);
      auVar32 = vfnmadd213ss_avx512f(auVar32,auVar53,auVar29);
      auVar43 = vfmsub213ss_avx512f(auVar44,auVar53,auVar40);
      auVar41 = vfmadd231ss_avx512f(auVar41,auVar35,auVar48);
      auVar44 = vfmadd231ss_fma(auVar39,auVar49,auVar35);
      auVar35 = vaddss_avx512f(auVar37,auVar28);
      auVar28 = vsubss_avx512f(auVar28,auVar37);
      auVar37 = vaddss_avx512f(ZEXT416((uint)fVar2),auVar35);
      fVar2 = auVar35._0_4_ - fVar2;
      auVar35 = vaddss_avx512f(auVar30,auVar28);
      auVar39 = vsubss_avx512f(auVar28,auVar30);
      auVar28 = vfmsub213ss_avx512f(auVar33,auVar53,auVar41);
      auVar30 = vfnmadd213ss_avx512f(auVar34,auVar53,auVar44);
      auVar33 = vaddss_avx512f(auVar40,auVar28);
      auVar34 = vaddss_avx512f(auVar29,auVar30);
      auVar28 = vsubss_avx512f(auVar40,auVar28);
      auVar29 = vsubss_avx512f(auVar29,auVar30);
      auVar30 = vsubss_avx512f(auVar44,auVar32);
      auVar44 = vaddss_avx512f(auVar32,auVar44);
      auVar32 = vsubss_avx512f(auVar41,auVar43);
      auVar40 = vaddss_avx512f(auVar43,auVar41);
      auVar41 = vaddss_avx512f(auVar44,auVar34);
      auVar34 = vsubss_avx512f(auVar34,auVar44);
      auVar44 = vaddss_avx512f(auVar30,auVar28);
      auVar28 = vsubss_avx512f(auVar28,auVar30);
      auVar30 = vaddss_avx512f(auVar40,auVar33);
      auVar33 = vsubss_avx512f(auVar33,auVar40);
      auVar40 = vsubss_avx512f(auVar29,auVar32);
      auVar29 = vaddss_avx512f(auVar32,auVar29);
      fVar4 = auVar28._0_4_ * 0.70710677;
      fVar5 = auVar29._0_4_ * 0.70710677;
      auVar29 = vsubss_avx512f(auVar37,auVar30);
      auVar32 = vsubss_avx512f(auVar42,auVar41);
      auVar28 = vaddss_avx512f(auVar30,auVar37);
      auVar30 = vaddss_avx512f(auVar41,auVar42);
      auVar44 = vmulss_avx512f(auVar44,SUB6416(ZEXT464(0x3f3504f3),0));
      auVar37 = vsubss_avx512f(auVar31,auVar33);
      auVar31 = vaddss_avx512f(auVar33,auVar31);
      auVar33 = vmulss_avx512f(auVar40,SUB6416(ZEXT464(0x3f3504f3),0));
      auVar40 = vsubss_avx512f(auVar39,ZEXT416((uint)fVar4));
      auVar28 = vinsertps_avx512f(auVar28,auVar30,0x10);
      auVar30 = vaddss_avx512f(auVar34,ZEXT416((uint)fVar2));
      auVar41 = vaddss_avx512f(auVar44,auVar35);
      auVar42 = vsubss_avx512f(auVar38,auVar44);
      auVar44 = vinsertps_avx512f(auVar29,auVar32,0x10);
      auVar40 = vaddss_avx512f(auVar40,ZEXT416((uint)fVar5));
      auVar29 = vinsertps_avx(ZEXT416((uint)(fVar2 - auVar34._0_4_)),auVar31,0x10);
      auVar30 = vinsertps_avx512f(auVar30,auVar37,0x10);
      auVar31 = vfmsub213ss_fma(auVar39,auVar53,auVar40);
      auVar34 = ZEXT416((uint)(auVar36._0_4_ - (fVar4 + fVar5)));
      auVar32 = vfmsub213ss_fma(auVar36,auVar53,auVar34);
      auVar44 = vinsertps_avx512f(auVar44,auVar40,0x20);
      auVar44 = vinsertps_avx(auVar44,auVar34,0x30);
      auVar28 = vinsertps_avx512f(auVar28,auVar31,0x20);
      auVar34 = vaddss_avx512f(auVar42,auVar33);
      auVar28 = vinsertps_avx(auVar28,auVar32,0x30);
      auVar32 = vaddss_avx512f(auVar41,auVar33);
      auVar33 = vfmsub213ss_avx512f(auVar38,auVar53,auVar34);
      auVar31 = vfmsub213ss_fma(auVar35,auVar53,auVar32);
      auVar30 = vinsertps_avx512f(auVar30,auVar32,0x20);
      auVar30 = vinsertps_avx(auVar30,auVar34,0x30);
      auVar54._16_16_ = auVar30;
      auVar54._0_16_ = auVar44;
      auVar29 = vinsertps_avx(auVar29,auVar31,0x20);
      auVar29 = vinsertps_avx512f(auVar29,auVar33,0x30);
      auVar47 = vinsertf64x4_avx512f(ZEXT3264(CONCAT1616(auVar29,auVar28)),auVar54,1);
      auVar47 = vmulps_avx512f(auVar47,auVar46);
      *(undefined1 (*) [64])ioptr = auVar47;
      ioptr = (float *)((long)*(undefined1 (*) [64])ioptr + (1L << (M & 0x3fU)) * 4);
    }
    break;
  default:
    M_00 = M - 1;
    uVar26 = 1L << (M_00 & 0x3f);
    lVar20 = 1L << ((ulong)((int)M - 3) & 0x3f);
    uVar14 = -1L << (M - 2U & 0x3f);
    StageCnt = (long)(M - 2U) / 3;
    lVar17 = StageCnt * -3 + -2 + M;
    lVar12 = 2L << (M_00 & 0x3f);
    lVar24 = uVar26 + 3;
    uVar21 = uVar14 * 8 ^ 0xfffffffffffffffc;
    lVar18 = ~(uVar14 * 2) + uVar26;
    lVar27 = 0xc;
    ioptr_00 = ioptr;
    for (; 0 < Rows; Rows = Rows + -1) {
      fVar2 = *ioptr_00;
      pfVar1 = ioptr_00 + (uVar26 >> 1);
      fVar4 = pfVar1[uVar26] + *pfVar1;
      auVar44._8_4_ = 0x80000000;
      auVar44._0_8_ = 0x8000000080000000;
      auVar44._12_4_ = 0x80000000;
      auVar44 = vxorps_avx512vl(ZEXT416((uint)Utbl[lVar20]),auVar44);
      fVar11 = pfVar1[1] - pfVar1[uVar26 + 1];
      fVar7 = Utbl[lVar20] * (*pfVar1 - pfVar1[uVar26]);
      fVar8 = (pfVar1[uVar26 + 1] + pfVar1[1]) * auVar44._0_4_;
      fVar5 = (fVar4 - fVar7) + fVar8;
      fVar8 = fVar11 + fVar7 + fVar8;
      uVar3 = *(undefined8 *)(ioptr_00 + uVar26);
      auVar44 = vfmadd132ss_fma(ZEXT416((uint)fVar11),ZEXT416((uint)fVar8),ZEXT416(0xc0000000));
      *ioptr_00 = ioptr_00[1] + fVar2;
      ioptr_00[1] = fVar2 - ioptr_00[1];
      auVar30._0_4_ = (float)uVar3 * 2.0;
      auVar30._4_4_ = (float)((ulong)uVar3 >> 0x20) * -2.0;
      auVar30._8_8_ = 0;
      auVar31 = SUB6416(ZEXT464(0x40000000),0);
      auVar28 = vfmsub132ss_fma(ZEXT416((uint)fVar4),ZEXT416((uint)fVar5),auVar31);
      uVar3 = vmovlps_avx(auVar30);
      *(undefined8 *)(ioptr_00 + uVar26) = uVar3;
      *pfVar1 = fVar5;
      pfVar1[1] = fVar8;
      pfVar1[uVar26] = auVar28._0_4_;
      pfVar1[uVar26 + 1] = auVar44._0_4_;
      fVar2 = Utbl[1];
      fVar4 = Utbl[~uVar14];
      lVar15 = 2;
      lVar13 = uVar14 * -4 + -8;
      lVar19 = lVar18;
      uVar22 = uVar21;
      lVar23 = lVar24;
      lVar25 = lVar27;
      while ((1 - lVar20) + lVar15 != 2) {
        fVar5 = *(float *)((long)ioptr + lVar25 + -4);
        fVar8 = *(float *)((long)ioptr + (uVar22 - 4));
        fVar7 = ioptr[lVar19] + *(float *)((long)ioptr + lVar25);
        fVar11 = ioptr[lVar19 + -1] + fVar5;
        fVar6 = ioptr[lVar23] + *(float *)((long)ioptr + uVar22);
        auVar30 = ZEXT416((uint)fVar4);
        auVar44 = ZEXT416((uint)(fVar5 - ioptr[lVar19 + -1]));
        auVar28 = vfnmsub231ss_fma(ZEXT416((uint)(fVar2 * fVar7)),auVar44,auVar30);
        auVar35 = ZEXT416((uint)(*(float *)((long)ioptr + lVar25) - ioptr[lVar19]));
        auVar36 = ZEXT416((uint)fVar2);
        auVar44 = vfmadd213ss_fma(auVar44,auVar36,auVar35);
        auVar32 = vfnmadd231ss_fma(auVar44,auVar30,ZEXT416((uint)fVar7));
        fVar2 = fVar11 + auVar28._0_4_;
        fVar5 = ioptr[lVar23 + -1] + fVar8;
        auVar28 = vfmsub213ss_fma(ZEXT416((uint)fVar11),auVar31,ZEXT416((uint)fVar2));
        auVar34 = ZEXT416((uint)(*(float *)((long)ioptr + uVar22) - ioptr[lVar23]));
        auVar33 = ZEXT416((uint)(fVar8 - ioptr[lVar23 + -1]));
        auVar44 = vfmadd213ss_fma(auVar30,auVar33,auVar34);
        auVar33 = vfnmsub231ss_fma(ZEXT416((uint)(fVar6 * fVar4)),auVar33,auVar36);
        *(float *)((long)ioptr + lVar25 + -4) = fVar2;
        auVar30 = vfnmadd213ss_fma(auVar35,auVar31,auVar32);
        *(int *)((long)ioptr + lVar25) = auVar32._0_4_;
        lVar25 = lVar25 + 8;
        ioptr[lVar19 + -1] = auVar28._0_4_;
        auVar32 = vfnmadd231ss_fma(auVar44,ZEXT416((uint)fVar6),auVar36);
        fVar8 = auVar33._0_4_ + fVar5;
        ioptr[lVar19] = auVar30._0_4_;
        lVar19 = lVar19 + -2;
        fVar4 = *(float *)((long)Utbl + lVar13);
        fVar2 = Utbl[lVar15];
        lVar15 = lVar15 + 1;
        lVar13 = lVar13 + -4;
        auVar44 = vfmsub213ss_fma(ZEXT416((uint)fVar5),auVar31,ZEXT416((uint)fVar8));
        *(float *)((long)ioptr + (uVar22 - 4)) = fVar8;
        auVar28 = vfnmadd213ss_fma(auVar34,auVar31,auVar32);
        *(int *)((long)ioptr + uVar22) = auVar32._0_4_;
        uVar22 = uVar22 - 8;
        ioptr[lVar23 + -1] = auVar44._0_4_;
        ioptr[lVar23] = auVar28._0_4_;
        lVar23 = lVar23 + 2;
      }
      scbitrevR2(ioptr_00,M_00,BRLow,auVar29._0_4_);
      if (lVar17 == 2) {
        ibfR4(ioptr_00,M_00,2);
        lStack_d0 = 8;
      }
      else {
        lStack_d0 = 2;
        if (lVar17 == 1) {
          ibfR2(ioptr_00,M_00,NDiffU);
          lStack_d0 = 4;
        }
      }
      if (M_00 < 0xc) {
        ibfstages(ioptr_00,M_00,Utbl,2,lStack_d0,StageCnt);
      }
      else {
        ifftrecurs(ioptr_00,M_00,Utbl,2,lStack_d0,StageCnt);
      }
      ioptr_00 = ioptr_00 + lVar12;
      lVar27 = lVar27 + lVar12 * 4;
      lVar24 = lVar24 + lVar12;
      uVar21 = uVar21 + lVar12 * 4;
      lVar18 = lVar18 + lVar12;
    }
  }
  return;
}

Assistant:

void riffts1(float *ioptr, long M, long Rows, float *Utbl, short *BRLow){
/* Compute in-place real ifft on the rows of the input array	*/
/* data order as from rffts1 */
/* INPUTS */
/* *ioptr = input data array in the following order	*/
/* M = log2 of fft size	*/
/* Re(x[0]), Re(x[N/2]), Re(x[1]), Im(x[1]), Re(x[2]), Im(x[2]), ... Re(x[N/2-1]), Im(x[N/2-1]). */
/* Rows = number of rows in ioptr array (use Rows of 1 if ioptr is a 1 dimensional array)	*/
/* *Utbl = cosine table	*/
/* *BRLow = bit reversed counter table	*/
/* OUTPUTS */
/* *ioptr = real output data array	*/

float	scale;
long 	StageCnt;
long 	NDiffU;

scale = 1.0/POW2(M);
M=M-1;
switch (M){
case -1:
	break;
case 0:
	for (;Rows>0;Rows--){
		rifft1pt(ioptr, scale);				/* a 2 pt fft */
		ioptr += 2*POW2(M);
	}
case 1:
	for (;Rows>0;Rows--){
		rifft2pt(ioptr, scale);				/* a 4 pt fft */
		ioptr += 2*POW2(M);
	}
	break;
case 2:
	for (;Rows>0;Rows--){
		rifft4pt(ioptr, scale);				/* an 8 pt fft */
		ioptr += 2*POW2(M);
	}
	break;
case 3:
	for (;Rows>0;Rows--){
		rifft8pt(ioptr, scale);				/* a 16 pt fft */
		ioptr += 2*POW2(M);
	}
	break;
default:
	for (;Rows>0;Rows--){

		ifrstage(ioptr, M+1, Utbl);

		scbitrevR2(ioptr, M, BRLow, scale);						/* bit reverse and first radix 2 stage */
		
		StageCnt = (M-1) / 3;		// number of radix 8 stages
		NDiffU = 2;				// one radix 2 stage already complete

		if ( (M-1-(StageCnt * 3)) == 1 ){
			ibfR2(ioptr, M, NDiffU);			/* 1 radix 2 stage */
			NDiffU *= 2;
		}

		if ( (M-1-(StageCnt * 3)) == 2 ){
			ibfR4(ioptr, M, NDiffU);			/* 1 radix 4 stage */
			NDiffU *= 4;
		}

		if (M <= MCACHE){
			ibfstages(ioptr, M, Utbl, 2, NDiffU, StageCnt);		/*  RADIX 8 Stages	*/
		}

		else{
			ifftrecurs(ioptr, M, Utbl, 2, NDiffU, StageCnt);		/*  RADIX 8 Stages	*/
		}

		ioptr += 2*POW2(M);
	}
}
}